

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_table.c
# Opt level: O2

int lj_cf_table_pack(lua_State *L)

{
  uint uVar1;
  TValue *pTVar2;
  int iVar3;
  GCtab *t;
  TValue *pTVar4;
  ulong uVar5;
  uint32_t asize;
  ulong uVar6;
  
  pTVar2 = L->base;
  uVar6 = (ulong)((long)L->top - (long)pTVar2) >> 3;
  iVar3 = (int)uVar6;
  asize = iVar3 + 1;
  if (iVar3 == 0) {
    asize = 0;
  }
  t = lj_tab_new(L,asize,1);
  pTVar4 = lj_tab_setstr(L,t,(GCstr *)(ulong)*(uint *)((ulong)L->base[-1].u32.lo + 0x20));
  pTVar4->n = (double)iVar3;
  uVar1 = (t->array).ptr32;
  for (uVar5 = 0; (uVar6 & 0xffffffff) != uVar5; uVar5 = uVar5 + 1) {
    *(TValue *)((ulong)uVar1 + 8 + uVar5 * 8) = pTVar2[uVar5];
  }
  (pTVar2->u32).lo = (uint32_t)t;
  (pTVar2->field_2).it = 0xfffffff4;
  L->top = pTVar2 + 1;
  uVar6 = (ulong)(L->glref).ptr32;
  if (*(uint *)(uVar6 + 0x24) <= *(uint *)(uVar6 + 0x20)) {
    lj_gc_step(L);
  }
  return 1;
}

Assistant:

LJLIB_CF(table_pack)
{
  TValue *array, *base = L->base;
  MSize i, n = (uint32_t)(L->top - base);
  GCtab *t = lj_tab_new(L, n ? n+1 : 0, 1);
  /* NOBARRIER: The table is new (marked white). */
  setintV(lj_tab_setstr(L, t, strV(lj_lib_upvalue(L, 1))), (int32_t)n);
  for (array = tvref(t->array) + 1, i = 0; i < n; i++)
    copyTV(L, &array[i], &base[i]);
  settabV(L, base, t);
  L->top = base+1;
  lj_gc_check(L);
  return 1;
}